

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

value_type __thiscall
andres::
BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
::operator()(BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
             *this,int it)

{
  reference pfVar1;
  reference pfVar2;
  int local_20;
  int local_1c;
  
  local_20 = it;
  pfVar1 = marray_detail::AccessOperatorHelper<true>::
           execute<float,int,true,std::allocator<unsigned_long>>
                     (*(View<float,_true,_std::allocator<unsigned_long>_> **)this,&local_20);
  local_1c = it;
  pfVar2 = marray_detail::AccessOperatorHelper<true>::
           execute<float,int,true,std::allocator<unsigned_long>>
                     (*(View<float,_true,_std::allocator<unsigned_long>_> **)(this + 8),&local_1c);
  return *pfVar1 - *pfVar2;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }